

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zeMemAllocShared
          (ze_context_handle_t hContext,ze_device_mem_alloc_desc_t *device_desc,
          ze_host_mem_alloc_desc_t *host_desc,size_t size,size_t alignment,
          ze_device_handle_t hDevice,void **pptr)

{
  ze_result_t zVar1;
  
  if (DAT_0010e488 != (code *)0x0) {
    zVar1 = (*DAT_0010e488)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemAllocShared(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_device_mem_alloc_desc_t* device_desc,  ///< [in] pointer to device memory allocation descriptor
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        ze_device_handle_t hDevice,                     ///< [in][optional] device handle to associate with
        void** pptr                                     ///< [out] pointer to shared allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAllocShared = context.zeDdiTable.Mem.pfnAllocShared;
        if( nullptr != pfnAllocShared )
        {
            result = pfnAllocShared( hContext, device_desc, host_desc, size, alignment, hDevice, pptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }